

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O1

void __thiscall QFontComboBoxPrivate::currentChanged(QFontComboBoxPrivate *this,QString *text)

{
  QObject *pQVar1;
  long lVar2;
  long lVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  char cVar7;
  QString *data;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QArrayData *d;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::families();
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    lVar2 = ((local_78.ptr)->d).size;
    lVar3 = (text->d).size;
    if (lVar2 == lVar3) {
      QVar8.m_data = ((local_78.ptr)->d).ptr;
      QVar8.m_size = lVar2;
      QVar9.m_data = (text->d).ptr;
      QVar9.m_size = lVar3;
      cVar7 = QtPrivate::equalStrings(QVar8,QVar9);
      if (cVar7 != '\0') goto LAB_0040e4b7;
    }
  }
  pQVar4 = &((text->d).d)->super_QArrayData;
  pcVar5 = (text->d).ptr;
  qVar6 = (text->d).size;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_58,0x18,0x10,1,KeepSize);
  ((local_58.ptr)->d).d = (Data *)pQVar4;
  ((local_58.ptr)->d).ptr = pcVar5;
  ((local_58.ptr)->d).size = qVar6;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.size = 1;
  QFont::setFamilies((QList_conflict *)&this->currentFont);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)&this->currentFont;
  QMetaObject::activate(pQVar1,&QFontComboBox::staticMetaObject,0,&local_58.d);
LAB_0040e4b7:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBoxPrivate::currentChanged(const QString &text)
{
    Q_Q(QFontComboBox);
    const QStringList families = currentFont.families();
    if (families.isEmpty() || families.first() != text) {
        currentFont.setFamilies(QStringList{text});
        emit q->currentFontChanged(currentFont);
    }
}